

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

bool __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::insert_no_grow(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                 *this,insert_result *result,block *k,empty_type *v)

{
  raw_node *prVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  raw_node *__s1;
  ulong uVar9;
  uint uVar10;
  ulong uVar8;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar4 = fast_hash(k,0x40);
  uVar10 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  uVar8 = (ulong)uVar10;
  prVar1 = (this->m_values).m_p;
  __s1 = prVar1 + uVar8;
  if (prVar1[uVar8].m_bits[0x41] != '\0') {
    iVar5 = bcmp(__s1,k,0x40);
    if (iVar5 == 0) {
      bVar3 = false;
      goto LAB_00106b2e;
    }
    uVar9 = (ulong)((this->m_values).m_size - 1);
    do {
      iVar5 = (int)uVar8;
      uVar8 = (ulong)(iVar5 - 1);
      if (iVar5 == 0) {
        uVar8 = uVar9;
      }
      uVar7 = (uint)uVar8;
      __s1 = __s1 + -1;
      if (iVar5 == 0) {
        __s1 = prVar1 + uVar9;
      }
      bVar3 = uVar10 != uVar7;
      if ((uVar10 == uVar7) || (__s1->m_bits[0x41] == '\0')) {
        bVar2 = false;
        goto LAB_00106acc;
      }
      iVar5 = bcmp(__s1,k,0x40);
    } while (iVar5 != 0);
    (result->first).m_pTable = this;
    (result->first).m_index = uVar7;
    result->second = false;
    bVar2 = true;
    bVar3 = false;
LAB_00106acc:
    uVar10 = uVar7;
    if (!bVar3) {
      return bVar2;
    }
  }
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  lVar6 = 0;
  do {
    __s1->m_bits[lVar6 * 4] = k->m_c[lVar6].field_0.field_0.r;
    __s1->m_bits[lVar6 * 4 + 1] = k->m_c[lVar6].field_0.field_0.g;
    __s1->m_bits[lVar6 * 4 + 2] = k->m_c[lVar6].field_0.field_0.b;
    __s1->m_bits[lVar6 * 4 + 3] = k->m_c[lVar6].field_0.field_0.a;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  *(empty_type *)(__s1->m_bits + 0x40) = *v;
  __s1->m_bits[0x41] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar3 = true;
LAB_00106b2e:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar10;
  result->second = bVar3;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }